

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall helics::Federate::enteringExecutingMode(Federate *this,iteration_time res)

{
  TimeRepresentation<count_time<9,_long>_> __args;
  Modes MStack_20;
  
  __args.internalTimeCode = (baseType)res.grantedTime.internalTimeCode;
  switch(res.state) {
  case NEXT_STEP:
    updateFederateMode(this,EXECUTING);
    (this->mCurrentTime).internalTimeCode = __args.internalTimeCode;
    if ((this->timeUpdateCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::operator()
                (&this->timeUpdateCallback,__args,false);
    }
    (*this->_vptr_Federate[0xc])(this,__args.internalTimeCode,0);
    if ((this->timeRequestReturnCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::operator()
                (&this->timeRequestReturnCallback,
                 (TimeRepresentation<count_time<9,_long>_>)(this->mCurrentTime).internalTimeCode,
                 false);
      return;
    }
  default:
    return;
  case ITERATING:
    (this->mCurrentTime).internalTimeCode = -1;
    enteringInitializingMode(this,ITERATING);
    (*this->_vptr_Federate[0xc])(this,__args.internalTimeCode,2);
    return;
  case HALTED:
    MStack_20 = FINISHED;
    break;
  case ERROR_RESULT:
    MStack_20 = ERROR_STATE;
  }
  updateFederateMode(this,MStack_20);
  return;
}

Assistant:

void Federate::enteringExecutingMode(iteration_time res)
{
    switch (res.state) {
        case IterationResult::NEXT_STEP:
            updateFederateMode(Modes::EXECUTING);

            mCurrentTime = res.grantedTime;
            if (timeUpdateCallback) {
                timeUpdateCallback(mCurrentTime, false);
            }
            initializeToExecuteStateTransition(res);
            if (timeRequestReturnCallback) {
                timeRequestReturnCallback(mCurrentTime, false);
            }
            break;
        case IterationResult::ITERATING:
            mCurrentTime = initializationTime;

            enteringInitializingMode(res.state);

            initializeToExecuteStateTransition(res);
            break;
        case IterationResult::ERROR_RESULT:
            updateFederateMode(Modes::ERROR_STATE);
            break;
        case IterationResult::HALTED:
            updateFederateMode(Modes::FINISHED);
            break;
    }
}